

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
  *pFVar6;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar7;
  value_type vVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  vVar8 = FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar4 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar9 = sin(((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_) /
              (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar4 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  dVar2 = (pFVar5->dx_).ptr_to_data[i];
  dVar3 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar10 = cos((dVar1 * pFVar5->val_) / dVar3);
  pFVar6 = this->left_;
  pFVar7 = (pFVar6->fadexpr_).left_;
  pFVar4 = (pFVar7->fadexpr_).expr_.fadexpr_.left_;
  dVar11 = cos(((pFVar4->fadexpr_).left_.constant_ *
               (*(Fad<double> **)((long)&pFVar4->fadexpr_ + 0x10))->val_) /
               (pFVar7->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar7 = (pFVar6->fadexpr_).right_;
  pFVar4 = (pFVar7->fadexpr_).expr_.fadexpr_.left_;
  dVar12 = cos(((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_) /
               (pFVar7->fadexpr_).expr_.fadexpr_.right_.constant_);
  return dVar12 * dVar11 * dVar10 * ((dVar2 * dVar1) / dVar3) + dVar9 * vVar8;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}